

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buchb.h
# Opt level: O0

void __thiscall
GF2::CritPair<137UL,_GF2::MOGrlex<137UL>_>::GetSPoly
          (CritPair<137UL,_GF2::MOGrlex<137UL>_> *this,MP<137UL,_GF2::MOGrlex<137UL>_> *spoly)

{
  bool bVar1;
  pointer this_00;
  MP<137UL,_GF2::MOGrlex<137UL>_> *this_01;
  MP<137UL,_GF2::MOGrlex<137UL>_> *in_RSI;
  long *in_RDI;
  MP<137UL,_GF2::MOGrlex<137UL>_> *in_stack_00000038;
  MP<137UL,_GF2::MOGrlex<137UL>_> *in_stack_00000040;
  MOGrlex<137UL> *in_stack_ffffffffffffffc8;
  MP<137UL,_GF2::MOGrlex<137UL>_> *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  
  this_00 = std::_List_iterator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>::operator->
                      ((_List_iterator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_> *)0x18684b);
  MP<137UL,_GF2::MOGrlex<137UL>_>::GetOrder(this_00);
  MP<137UL,_GF2::MOGrlex<137UL>_>::SetOrder(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::_List_iterator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>::operator*
            ((_List_iterator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_> *)0x18686e);
  MP<137UL,_GF2::MOGrlex<137UL>_>::operator=
            (in_stack_ffffffffffffffd0,(MP<137UL,_GF2::MOGrlex<137UL>_> *)in_stack_ffffffffffffffc8)
  ;
  if (*in_RDI == -1) {
    std::_List_iterator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>::operator*
              ((_List_iterator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_> *)0x18689e);
    MP<137UL,_GF2::MOGrlex<137UL>_>::SPoly(in_stack_00000040,in_stack_00000038);
  }
  else {
    MP<137UL,_GF2::MOGrlex<137UL>_>::SPoly(in_RSI,in_stack_ffffffffffffffd8);
    bVar1 = MP<137UL,_GF2::MOGrlex<137UL>_>::operator!=
                      (in_RSI,SUB81(in_stack_ffffffffffffffd8 >> 0x38,0));
    if (bVar1) {
      this_01 = (MP<137UL,_GF2::MOGrlex<137UL>_> *)
                MP<137UL,_GF2::MOGrlex<137UL>_>::LM(in_stack_ffffffffffffffd0);
      std::_List_iterator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>::operator->
                ((_List_iterator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_> *)0x1868ee);
      MP<137UL,_GF2::MOGrlex<137UL>_>::LM(this_01);
      bVar1 = WW<137ul>::operator==((WW<137UL> *)this_01,(WW<137UL> *)in_stack_ffffffffffffffc8);
      if (bVar1) {
        std::_List_iterator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>::operator*
                  ((_List_iterator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_> *)0x186917);
        MP<137UL,_GF2::MOGrlex<137UL>_>::operator+=
                  (this_01,(MP<137UL,_GF2::MOGrlex<137UL>_> *)in_stack_ffffffffffffffc8);
      }
    }
  }
  return;
}

Assistant:

void GetSPoly(MP<_n, _O>& spoly) const
	{
		spoly.SetOrder(iter2->GetOrder());
		spoly = *iter2;
		if (var1 == SIZE_MAX)
			// S-многочлен для пары явных многочленов
			spoly.SPoly(*iter1);
		else
		{
			// S(x_i^2-x_i, f) = f x_i mod (x_i^2-x_i)
			spoly.SPoly(var1);
			if (spoly != 0 && spoly.LM() == iter2->LM())
				spoly += *iter2;
		}
	}